

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<float>::DecomposeColumn
          (TPZSkylMatrix<float> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  int64_t iVar1;
  int64_t iVar2;
  float *pfVar3;
  float *pfVar4;
  long in_RDX;
  long in_RSI;
  value_type_conflict5 *in_RDI;
  float fVar5;
  double dVar6;
  float pivot;
  float sum;
  float *run2;
  float *run1;
  int64_t minline;
  int64_t skcol;
  int64_t skprev;
  float *ptrcol;
  float *ptrprev;
  int64_t in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  float fVar7;
  undefined4 in_stack_ffffffffffffffa4;
  float fVar8;
  float *local_58;
  float *local_50;
  long local_48;
  
  iVar1 = SkyHeight((TPZSkylMatrix<float> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(int64_t)in_RDI);
  iVar2 = SkyHeight((TPZSkylMatrix<float> *)
                    CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(int64_t)in_RDI);
  pfVar3 = Diag((TPZSkylMatrix<float> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
  pfVar4 = Diag((TPZSkylMatrix<float> *)
                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                in_stack_ffffffffffffff88);
  if (in_RSI - iVar2 < in_RDX - iVar1) {
    local_48 = in_RDX - iVar1;
  }
  else {
    local_48 = in_RSI - iVar2;
  }
  if (in_RDX < local_48) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
  }
  else {
    fVar8 = 0.0;
    local_58 = pfVar4 + (in_RSI - local_48);
    for (local_50 = pfVar3 + (in_RDX - local_48); local_50 != pfVar3; local_50 = local_50 + -1) {
      fVar8 = *local_50 * *local_58 + fVar8;
      local_58 = local_58 + -1;
    }
    *local_58 = *local_58 - fVar8;
    if (local_50 == local_58) {
      fVar7 = *local_58;
      dVar6 = std::fabs((double)(ulong)(uint)fVar7);
      fVar5 = SUB84(dVar6,0);
      dVar6 = std::fabs(3.88416355131361e-315);
      if (fVar5 < SUB84(dVar6,0)) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back
                  ((list<long,_std::allocator<long>_> *)CONCAT44(fVar8,fVar7),in_RDI);
        fVar7 = 1.0;
      }
      dVar6 = std::sqrt((double)(ulong)(uint)fVar7);
      *local_58 = SUB84(dVar6,0);
    }
    else {
      *local_58 = *local_58 / *local_50;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}